

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O1

int main(int argc,char **argv)

{
  GLint GVar1;
  GLFWwindow *handle;
  int iVar2;
  GLuint GVar3;
  GLuint GVar4;
  GLuint GVar5;
  GLint GVar6;
  time_t tVar7;
  GLFWwindow *pGVar8;
  GLfloat *pGVar9;
  long lVar10;
  char *pcVar11;
  long lVar12;
  int right;
  int left;
  GLuint texture;
  GLint local_190;
  GLint local_18c;
  int width;
  GLuint vertex_buffer;
  GLFWwindow *local_180;
  GLFWwindow *windows [2];
  int ypos;
  undefined8 uStack_150;
  undefined8 local_148;
  char pixels [256];
  
  tVar7 = time((time_t *)0x0);
  srand((uint)tVar7);
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    do {
      while (iVar2 = getopt(argc,argv,"d"), iVar2 == 100) {
        glfwWindowHint(0x22007,1);
      }
    } while (iVar2 != -1);
    glfwWindowHint(0x22002,2);
    glfwWindowHint(0x22003,0);
    pGVar8 = glfwCreateWindow(400,400,"First",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    windows[0] = pGVar8;
    if (pGVar8 != (GLFWwindow *)0x0) {
      glfwSetKeyCallback(pGVar8,key_callback);
      glfwMakeContextCurrent(pGVar8);
      glfwSwapInterval(1);
      gladLoadGLLoader(glfwGetProcAddress);
      if (GLAD_GL_KHR_debug != 0) {
        (*glad_glDebugMessageCallback)(debug_callback,(void *)0x0);
        (*glad_glDebugMessageControl)(0x1100,0x1100,0x1100,0,(GLuint *)0x0,'\x01');
      }
      (*glad_glGenTextures)(1,&texture);
      (*glad_glBindTexture)(0xde1,texture);
      pcVar11 = pixels;
      lVar12 = 0;
      do {
        lVar10 = 0;
        do {
          iVar2 = rand();
          pcVar11[lVar10] = (char)iVar2;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x10);
        lVar12 = lVar12 + 1;
        pcVar11 = pcVar11 + 0x10;
      } while (lVar12 != 0x10);
      (*glad_glTexImage2D)(0xde1,0,0x1909,0x10,0x10,0,0x1909,0x1401,pixels);
      (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
      (*glad_glTexParameteri)(0xde1,0x2800,0x2600);
      GVar3 = (*glad_glCreateShader)(0x8b31);
      (*glad_glShaderSource)(GVar3,1,&vertex_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar3);
      GVar4 = (*glad_glCreateShader)(0x8b30);
      (*glad_glShaderSource)(GVar4,1,&fragment_shader_text,(GLint *)0x0);
      (*glad_glCompileShader)(GVar4);
      GVar5 = (*glad_glCreateProgram)();
      (*glad_glAttachShader)(GVar5,GVar3);
      (*glad_glAttachShader)(GVar5,GVar4);
      (*glad_glLinkProgram)(GVar5);
      local_18c = (*glad_glGetUniformLocation)(GVar5,"MVP");
      local_190 = (*glad_glGetUniformLocation)(GVar5,"color");
      GVar6 = (*glad_glGetUniformLocation)(GVar5,"texture");
      GVar3 = (*glad_glGetAttribLocation)(GVar5,"vPos");
      (*glad_glGenBuffers)(1,&vertex_buffer);
      (*glad_glBindBuffer)(0x8892,vertex_buffer);
      (*glad_glBufferData)(0x8892,0x20,vertices,0x88e4);
      (*glad_glUseProgram)(GVar5);
      (*glad_glUniform1i)(GVar6,0);
      (*glad_glEnable)(0xde1);
      (*glad_glBindTexture)(0xde1,texture);
      (*glad_glBindBuffer)(0x8892,vertex_buffer);
      (*glad_glEnableVertexAttribArray)(GVar3);
      (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
      local_180 = glfwCreateWindow(400,400,"Second",(GLFWmonitor *)0x0,pGVar8);
      windows[1] = local_180;
      if (local_180 != (GLFWwindow *)0x0) {
        glfwGetWindowSize(pGVar8,&width,(int *)0x0);
        glfwGetWindowFrameSize(pGVar8,&left,(int *)0x0,&right,(int *)0x0);
        glfwGetWindowPos(pGVar8,(int *)pixels,&ypos);
        pGVar8 = local_180;
        glfwSetWindowPos(local_180,width + pixels._0_4_ + left + right,ypos);
        glfwSetKeyCallback(pGVar8,key_callback);
        glfwMakeContextCurrent(pGVar8);
        (*glad_glUseProgram)(GVar5);
        (*glad_glEnable)(0xde1);
        (*glad_glBindTexture)(0xde1,texture);
        (*glad_glBindBuffer)(0x8892,vertex_buffer);
        (*glad_glEnableVertexAttribArray)(GVar3);
        (*glad_glVertexAttribPointer)(GVar3,2,0x1406,'\0',8,(void *)0x0);
        handle = windows[0];
        iVar2 = glfwWindowShouldClose(windows[0]);
        GVar1 = local_18c;
        GVar6 = local_190;
        while ((iVar2 == 0 && (iVar2 = glfwWindowShouldClose(pGVar8), iVar2 == 0))) {
          _ypos = 0x3ecccccd3e99999a;
          uStack_150 = 0x3f4ccccd3f800000;
          local_148 = 0x3f8000003ecccccd;
          pGVar9 = (GLfloat *)&ypos;
          lVar12 = 0;
          do {
            pGVar8 = windows[lVar12];
            glfwGetFramebufferSize(pGVar8,&left,&right);
            glfwMakeContextCurrent(pGVar8);
            (*glad_glViewport)(0,0,left,right);
            pixels[0] = '\0';
            pixels[1] = '\0';
            pixels[2] = '\0';
            pixels[3] = '@';
            pixels[4] = '\0';
            pixels[5] = '\0';
            pixels[6] = '\0';
            pixels[7] = '\0';
            pixels[8] = '\0';
            pixels[9] = '\0';
            pixels[10] = '\0';
            pixels[0xb] = '\0';
            pixels[0xc] = '\0';
            pixels[0xd] = '\0';
            pixels[0xe] = '\0';
            pixels[0xf] = '\0';
            pixels[0x10] = '\0';
            pixels[0x11] = '\0';
            pixels[0x12] = '\0';
            pixels[0x13] = '\0';
            pixels[0x14] = '\0';
            pixels[0x15] = '\0';
            pixels[0x16] = '\0';
            pixels[0x17] = '@';
            pixels[0x18] = '\0';
            pixels[0x19] = '\0';
            pixels[0x1a] = '\0';
            pixels[0x1b] = '\0';
            pixels[0x1c] = '\0';
            pixels[0x1d] = '\0';
            pixels[0x1e] = '\0';
            pixels[0x1f] = '\0';
            pixels[0x28] = '\0';
            pixels[0x29] = '\0';
            pixels[0x2a] = '\0';
            pixels[0x2b] = -0x40;
            pixels[0x2c] = '\0';
            pixels[0x2d] = '\0';
            pixels[0x2e] = '\0';
            pixels[0x2f] = '\0';
            pixels[0x20] = '\0';
            pixels[0x21] = '\0';
            pixels[0x22] = '\0';
            pixels[0x23] = '\0';
            pixels[0x24] = '\0';
            pixels[0x25] = '\0';
            pixels[0x26] = '\0';
            pixels[0x27] = '\0';
            pixels[0x30] = '\0';
            pixels[0x31] = '\0';
            pixels[0x32] = -0x80;
            pixels[0x33] = -0x41;
            pixels[0x34] = '\0';
            pixels[0x35] = '\0';
            pixels[0x36] = -0x80;
            pixels[0x37] = -0x41;
            pixels[0x38] = '\0';
            pixels[0x39] = '\0';
            pixels[0x3a] = -0x80;
            pixels[0x3b] = -0x41;
            pixels[0x3c] = '\0';
            pixels[0x3d] = '\0';
            pixels[0x3e] = -0x80;
            pixels[0x3f] = '?';
            (*glad_glUniformMatrix4fv)(GVar1,1,'\0',(GLfloat *)pixels);
            (*glad_glUniform3fv)(GVar6,1,pGVar9);
            (*glad_glDrawArrays)(6,0,4);
            glfwSwapBuffers(pGVar8);
            lVar12 = lVar12 + 1;
            pGVar9 = pGVar9 + 3;
          } while (lVar12 == 1);
          glfwWaitEvents();
          iVar2 = glfwWindowShouldClose(handle);
          pGVar8 = local_180;
        }
        glfwTerminate();
        exit(0);
      }
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(int argc, char** argv)
{
    int ch;
    GLFWwindow* windows[2];
    GLuint texture, program, vertex_buffer;
    GLint mvp_location, vpos_location, color_location, texture_location;

    srand((unsigned int) time(NULL));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    while ((ch = getopt(argc, argv, "d")) != -1)
    {
        switch (ch)
        {
            case 'd':
                glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GLFW_TRUE);
                break;
        }
    }

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    windows[0] = glfwCreateWindow(400, 400, "First", NULL, NULL);
    if (!windows[0])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(windows[0], key_callback);

    glfwMakeContextCurrent(windows[0]);

    // Only enable vsync for the first of the windows to be swapped to
    // avoid waiting out the interval for each window
    glfwSwapInterval(1);

    // The contexts are created with the same APIs so the function
    // pointers should be re-usable between them
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);

    if (GLAD_GL_KHR_debug)
    {
        glDebugMessageCallback(debug_callback, NULL);
        glDebugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, NULL, GL_TRUE);
    }

    // Create the OpenGL objects inside the first context, created above
    // All objects will be shared with the second context, created below
    {
        int x, y;
        char pixels[16 * 16];
        GLuint vertex_shader, fragment_shader;

        glGenTextures(1, &texture);
        glBindTexture(GL_TEXTURE_2D, texture);

        for (y = 0;  y < 16;  y++)
        {
            for (x = 0;  x < 16;  x++)
                pixels[y * 16 + x] = rand() % 256;
        }

        glTexImage2D(GL_TEXTURE_2D, 0, GL_LUMINANCE, 16, 16, 0, GL_LUMINANCE, GL_UNSIGNED_BYTE, pixels);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
        glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

        vertex_shader = glCreateShader(GL_VERTEX_SHADER);
        glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
        glCompileShader(vertex_shader);

        fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
        glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
        glCompileShader(fragment_shader);

        program = glCreateProgram();
        glAttachShader(program, vertex_shader);
        glAttachShader(program, fragment_shader);
        glLinkProgram(program);

        mvp_location = glGetUniformLocation(program, "MVP");
        color_location = glGetUniformLocation(program, "color");
        texture_location = glGetUniformLocation(program, "texture");
        vpos_location = glGetAttribLocation(program, "vPos");

        glGenBuffers(1, &vertex_buffer);
        glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
    }

    glUseProgram(program);
    glUniform1i(texture_location, 0);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    windows[1] = glfwCreateWindow(400, 400, "Second", NULL, windows[0]);
    if (!windows[1])
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    // Place the second window to the right of the first
    {
        int xpos, ypos, left, right, width;

        glfwGetWindowSize(windows[0], &width, NULL);
        glfwGetWindowFrameSize(windows[0], &left, NULL, &right, NULL);
        glfwGetWindowPos(windows[0], &xpos, &ypos);

        glfwSetWindowPos(windows[1], xpos + width + left + right, ypos);
    }

    glfwSetKeyCallback(windows[1], key_callback);

    glfwMakeContextCurrent(windows[1]);

    // While objects are shared, the global context state is not and will
    // need to be set up for each context

    glUseProgram(program);

    glEnable(GL_TEXTURE_2D);
    glBindTexture(GL_TEXTURE_2D, texture);

    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);

    while (!glfwWindowShouldClose(windows[0]) &&
           !glfwWindowShouldClose(windows[1]))
    {
        int i;
        const vec3 colors[2] =
        {
            { 0.3f, 0.4f, 1.f },
            { 0.8f, 0.4f, 1.f }
        };

        for (i = 0;  i < 2;  i++)
        {
            int width, height;
            mat4x4 mvp;

            glfwGetFramebufferSize(windows[i], &width, &height);
            glfwMakeContextCurrent(windows[i]);

            glViewport(0, 0, width, height);

            mat4x4_ortho(mvp, 0.f, 1.f, 0.f, 1.f, 0.f, 1.f);
            glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
            glUniform3fv(color_location, 1, colors[i]);
            glDrawArrays(GL_TRIANGLE_FAN, 0, 4);

            glfwSwapBuffers(windows[i]);
        }

        glfwWaitEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}